

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O2

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  void *pvVar11;
  ulong uVar12;
  int p;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  
  Mat::create(top_blob,this->num_output,bottom_blob->c * (int)bottom_blob->cstep,4,
              opt->blob_allocator);
  pvVar8 = top_blob->data;
  iVar6 = -100;
  if ((pvVar8 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (this->int8_scale_term == 0) {
      iVar1 = this->input_dim;
      uVar2 = top_blob->w;
      pvVar8 = (this->bias_data).data;
      uVar12 = 0;
      if (0 < (int)uVar2) {
        uVar12 = (ulong)uVar2;
      }
      uVar9 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar9 = 0;
      }
      for (uVar14 = 0; iVar6 = 0, uVar14 != uVar9; uVar14 = uVar14 + 1) {
        iVar10 = top_blob->w;
        pvVar3 = top_blob->data;
        sVar5 = top_blob->elemsize;
        iVar7 = *(int *)((long)bottom_blob->data + uVar14 * 4);
        if (iVar7 < 1) {
          iVar7 = iVar6;
        }
        if (iVar1 <= iVar7) {
          iVar7 = iVar1 + -1;
        }
        pvVar11 = (void *)((long)(int)(iVar7 * uVar2) * 4 + (long)(this->weight_data).data);
        if (pvVar8 == (void *)0x0) {
          memcpy((void *)((long)pvVar3 + (long)iVar10 * uVar14 * sVar5),pvVar11,
                 (long)(int)uVar2 << 2);
        }
        else {
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)pvVar3 + uVar13 * 4 + sVar5 * uVar14 * (long)iVar10) =
                 *(float *)((long)pvVar8 + uVar13 * 4) + *(float *)((long)pvVar11 + uVar13 * 4);
          }
        }
      }
    }
    else {
      iVar1 = this->input_dim;
      uVar2 = top_blob->w;
      fVar15 = 1.0 / this->weight_data_int8_scale;
      pvVar3 = (this->bias_data).data;
      pvVar11 = bottom_blob->data;
      iVar6 = 0;
      uVar12 = 0;
      if (0 < (int)uVar2) {
        uVar12 = (ulong)uVar2;
      }
      pvVar4 = (this->weight_data).data;
      uVar9 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar9 = 0;
      }
      sVar5 = top_blob->elemsize;
      for (uVar14 = 0; uVar14 != uVar9; uVar14 = uVar14 + 1) {
        iVar10 = *(int *)((long)pvVar11 + uVar14 * 4);
        if (iVar10 < 1) {
          iVar10 = iVar6;
        }
        if (iVar1 <= iVar10) {
          iVar10 = iVar1 + -1;
        }
        uVar13 = 0;
        if (pvVar3 == (void *)0x0) {
          for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)pvVar8 + uVar13 * 4) =
                 (float)(int)*(char *)((long)pvVar4 + uVar13 + (long)(int)(iVar10 * uVar2)) * fVar15
            ;
          }
        }
        else {
          for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)pvVar8 + uVar13 * 4) =
                 (float)(int)*(char *)((long)pvVar4 + uVar13 + (long)(int)(iVar10 * uVar2)) * fVar15
                 + *(float *)((long)pvVar3 + uVar13 * 4);
          }
        }
        pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar2 * sVar5);
      }
    }
  }
  return iVar6;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = static_cast<int>(bottom_blob.total());

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if NCNN_INT8
    if (int8_scale_term)
    {
        embed_int8(bottom_blob, weight_data, weight_data_int8_scale, bias_data, top_blob, input_dim, opt);
    }
    else
#endif // NCNN_INT8
    {
        embed(bottom_blob, weight_data, bias_data, top_blob, input_dim, opt);
    }

    return 0;
}